

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

GLuint gl4cts::CopyImage::Utils::getNumberOfChannels(GLenum internal_format)

{
  TestError *this;
  GLuint local_10;
  GLuint result;
  GLenum internal_format_local;
  
  if (internal_format == 0x2a10) {
    return 3;
  }
  if (internal_format - 0x804f < 6) {
    return 3;
  }
  if (internal_format - 0x8055 < 7) {
    return 4;
  }
  if (internal_format - 0x8229 < 2) {
LAB_00e404f9:
    local_10 = 1;
  }
  else {
    if (1 < internal_format - 0x822b) {
      if (internal_format - 0x822d < 2) goto LAB_00e404f9;
      if (1 < internal_format - 0x822f) {
        if (internal_format - 0x8231 < 6) goto LAB_00e404f9;
        if (5 < internal_format - 0x8237) {
          if (internal_format == 0x8814) {
            return 4;
          }
          if (internal_format == 0x8815) {
            return 3;
          }
          if (internal_format == 0x881a) {
            return 4;
          }
          if (internal_format == 0x881b) {
            return 3;
          }
          if (internal_format == 0x8c3a) {
            return 3;
          }
          if (internal_format == 0x8c3d) {
            return 3;
          }
          if (internal_format == 0x8d70) {
            return 4;
          }
          if (internal_format == 0x8d71) {
            return 3;
          }
          if (internal_format == 0x8d76) {
            return 4;
          }
          if (internal_format == 0x8d77) {
            return 3;
          }
          if (internal_format == 0x8d7c) {
            return 4;
          }
          if (internal_format == 0x8d7d) {
            return 3;
          }
          if (internal_format == 0x8d82) {
            return 4;
          }
          if (internal_format == 0x8d83) {
            return 3;
          }
          if (internal_format == 0x8d88) {
            return 4;
          }
          if (internal_format == 0x8d89) {
            return 3;
          }
          if (internal_format == 0x8d8e) {
            return 4;
          }
          if (internal_format == 0x8d8f) {
            return 3;
          }
          if (internal_format == 0x8f94) goto LAB_00e404f9;
          if (internal_format != 0x8f95) {
            if (internal_format == 0x8f96) {
              return 3;
            }
            if (internal_format == 0x8f97) {
              return 4;
            }
            if (internal_format == 0x8f98) goto LAB_00e404f9;
            if (internal_format != 0x8f99) {
              if (internal_format == 0x8f9a) {
                return 3;
              }
              if (internal_format == 0x8f9b) {
                return 4;
              }
              if (internal_format == 0x906f) {
                return 4;
              }
              this = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this,"Invalid enum",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                         ,0x3a3);
              __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
            }
          }
        }
      }
    }
    local_10 = 2;
  }
  return local_10;
}

Assistant:

GLuint Utils::getNumberOfChannels(GLenum internal_format)
{
	GLuint result = 0;

	switch (internal_format)
	{
	case GL_R8:
	case GL_R8_SNORM:
	case GL_R16:
	case GL_R16F:
	case GL_R16_SNORM:
	case GL_R32F:
	case GL_R8I:
	case GL_R8UI:
	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
		result = 1;
		break;

	case GL_RG8:
	case GL_RG8_SNORM:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16_SNORM:
	case GL_RG32F:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
		result = 2;
		break;

	case GL_R3_G3_B2:
	case GL_RGB4:
	case GL_RGB5:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_RGB10:
	case GL_R11F_G11F_B10F:
	case GL_RGB12:
	case GL_RGB16:
	case GL_RGB16F:
	case GL_RGB16_SNORM:
	case GL_RGB32F:
	case GL_RGB9_E5:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB32I:
	case GL_RGB32UI:
		result = 3;
		break;

	case GL_RGBA2:
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_RGB10_A2:
	case GL_RGBA12:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16_SNORM:
	case GL_RGBA32F:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGB10_A2UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		result = 4;
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return result;
}